

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

int32_t __thiscall
helics::FederateState::getHandleOption
          (FederateState *this,InterfaceHandle handle,char iType,int32_t option)

{
  char in_DL;
  InterfaceHandle in_ESI;
  undefined8 in_RDI;
  int32_t option_00;
  undefined4 in_stack_ffffffffffffffdc;
  InterfaceHandle in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  option_00 = (int32_t)((ulong)in_RDI >> 0x20);
  if (in_DL == 'e') {
    local_4 = InterfaceInfo::getEndpointProperty
                        ((InterfaceInfo *)CONCAT44(in_ESI.hid,0x65),in_stack_ffffffffffffffe0,
                         option_00);
  }
  else if (in_DL == 'i') {
    local_4 = InterfaceInfo::getInputProperty
                        ((InterfaceInfo *)CONCAT44(in_stack_ffffffffffffffdc,0x69),
                         in_stack_ffffffffffffffe0,option_00);
  }
  else if (in_DL == 'p') {
    local_4 = InterfaceInfo::getPublicationProperty
                        ((InterfaceInfo *)CONCAT44(in_stack_ffffffffffffffdc,0x70),in_ESI,option_00)
    ;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int32_t FederateState::getHandleOption(InterfaceHandle handle, char iType, int32_t option) const
{
    switch (iType) {
        case 'i':
            return interfaceInformation.getInputProperty(handle, option);
        case 'p':
            return interfaceInformation.getPublicationProperty(handle, option);
        case 'e':
            return interfaceInformation.getEndpointProperty(handle, option);
        default:
            break;
    }
    return 0;
}